

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

void BN_POOL_release(BN_POOL *p,uint num)

{
  uint offset;
  uint num_local;
  BN_POOL *p_local;
  
  offset = p->used - 1 & 0xf;
  p->used = p->used - num;
  num_local = num;
  while (num_local != 0) {
    if (offset == 0) {
      offset = 0xf;
      p->current = p->current->prev;
      num_local = num_local - 1;
    }
    else {
      offset = offset - 1;
      num_local = num_local - 1;
    }
  }
  return;
}

Assistant:

static void BN_POOL_release(BN_POOL *p, unsigned int num)
{
    unsigned int offset = (p->used - 1) % BN_CTX_POOL_SIZE;

    p->used -= num;
    while (num--) {
        bn_check_top(p->current->vals + offset);
        if (offset == 0) {
            offset = BN_CTX_POOL_SIZE - 1;
            p->current = p->current->prev;
        } else
            offset--;
    }
}